

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

size_t __thiscall
ddd::DaTrie<true,_true,_true>::edge_size_
          (DaTrie<true,_true,_true> *this,uint32_t node_pos,size_t upper)

{
  pointer pNVar1;
  Bc BVar2;
  pointer pNVar3;
  size_t sVar4;
  size_t sVar5;
  pointer pNVar6;
  
  BVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
          super__Vector_impl_data._M_start[node_pos];
  if (-1 < (long)BVar2) {
    __assert_fail("bc_[node_pos].is_fixed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x3f8,
                  "size_t ddd::DaTrie<true, true, true>::edge_size_(uint32_t, size_t) const [WithBLM = true, WithNLM = true, Prefix = true]"
                 );
  }
  if (((ulong)BVar2 & 0x7fffffff) == 0x7fffffff || BVar2._0_4_ < 0) {
    sVar4 = 0;
  }
  else {
    pNVar3 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
             _M_impl.super__Vector_impl_data._M_start;
    sVar5 = upper + (upper == 0);
    pNVar1 = pNVar3 + node_pos;
    sVar4 = 0;
    pNVar6 = pNVar1;
    do {
      if (sVar5 - 1 == sVar4) {
        return sVar5;
      }
      sVar4 = sVar4 + 1;
      pNVar6 = (pointer)&pNVar3[(uint)pNVar6->child ^ (uint)((ulong)BVar2 & 0x7fffffff)].sib;
    } while (*(uint8_t *)pNVar6 != pNVar1->child);
  }
  return sVar4;
}

Assistant:

size_t edge_size_(uint32_t node_pos, size_t upper = 256) const {
    assert(bc_[node_pos].is_fixed());

    if (bc_[node_pos].is_leaf()) {
      return 0;
    }

    auto base = bc_[node_pos].base();
    if (base == INVALID_VALUE) { // for prefix subtrie
      return 0;
    }

    size_t size = 0;
    if (WithNLM) {
      auto child_pos = base ^node_links_[node_pos].child;
      while (++size < upper && node_links_[child_pos].sib != node_links_[node_pos].child) {
        child_pos = base ^ node_links_[child_pos].sib;
      }
    } else {
      for (uint32_t label = 0; label < 256; ++label) {
        auto child_pos = base ^label;
        if (bc_[child_pos].check() == node_pos && ++size >= upper) {
          break;
        }
      }
    }
    return size;
  }